

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O0

void __thiscall
spvtools::utils::
HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>>>
::
castTo<spvtools::utils::HexFloat<spvtools::utils::FloatProxy<float>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>>>>
          (HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>>>
           *this,HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
                 *other,round_direction round_dir)

{
  HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
  *pHVar1;
  uint_type uVar2;
  uint uVar3;
  bool bVar4;
  bool local_85;
  uint local_84;
  bool local_64;
  bool local_63;
  bool local_62;
  bool local_61;
  FloatProxy<float> local_4c;
  uint uStack_48;
  bool round_underflow_up;
  FloatProxy<float> local_44;
  uint_type shifted_significand;
  ushort local_3c;
  short local_3a;
  bool is_inf;
  uint_type uStack_38;
  bool is_nan;
  uint_type check_bit;
  int_type exponent;
  uint_type rounded_significand;
  bool carried;
  FloatProxy<float> FStack_2c;
  uint_type significand;
  byte local_25;
  FloatProxy<float> local_24;
  FloatProxy<float> FStack_20;
  bool negate;
  round_direction local_1c;
  HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
  *pHStack_18;
  round_direction round_dir_local;
  HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
  *other_local;
  HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
  *this_local;
  
  local_1c = round_dir;
  pHStack_18 = other;
  other_local = (HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
                 *)this;
  FloatProxy<float>::FloatProxy(&local_24,0.0);
  HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
  ::HexFloat((HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
              *)&stack0xffffffffffffffe0,local_24);
  (pHStack_18->value_).data_ = FStack_20.data_;
  local_25 = HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
             ::isNegative((HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
                           *)this);
  uVar2 = HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
          ::getUnsignedBits((HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
                             *)this);
  pHVar1 = pHStack_18;
  if (uVar2 == 0) {
    if ((local_25 & 1) != 0) {
      rounded_significand =
           (uint_type)
           HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
           ::value(pHStack_18);
      FStack_2c = FloatProxy<float>::operator-((FloatProxy<float> *)&rounded_significand);
      HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
      ::set_value(pHVar1,FStack_2c);
    }
  }
  else {
    exponent = HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
               ::getSignificandBits
                         ((HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
                           *)this);
    check_bit._1_1_ = 0;
    uStack_38 = getRoundedNormalizedSignificand<spvtools::utils::HexFloat<spvtools::utils::FloatProxy<float>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>>>>
                          (this,local_1c,(bool *)((long)&check_bit + 1));
    local_3a = HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
               ::getUnbiasedExponent
                         ((HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
                           *)this);
    if (local_3a == -0xf) {
      local_3a = -0xe;
      for (local_3c = 0x200;
          (local_3c != 0 && (local_3a = local_3a + -1, (local_3c & exponent) == 0));
          local_3c = (ushort)((int)(uint)local_3c >> 1)) {
      }
    }
    uVar2 = HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
            ::getBits((HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
                       *)this);
    bVar4 = (uVar2 & 0x7c00) == 0x7c00;
    local_61 = bVar4 && exponent != 0;
    shifted_significand._3_1_ = local_61;
    local_62 = false;
    if (!bVar4 || exponent == 0) {
      local_63 = true;
      if ((int)((int)local_3a + (uint)(check_bit._1_1_ & 1)) < 0x80) {
        local_64 = false;
        if (exponent == 0) {
          uVar2 = HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
                  ::getBits((HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
                             *)this);
          local_64 = (uVar2 & 0x7c00) == 0x7c00;
        }
        local_63 = local_64;
      }
      local_62 = local_63;
    }
    pHVar1 = pHStack_18;
    shifted_significand._2_1_ = local_62;
    if (local_62 == false) {
      if ((shifted_significand._3_1_ & 1) == 0) {
        bVar4 = HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
                ::isNegative((HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
                              *)this);
        if (bVar4) {
          local_85 = local_1c == kToNegativeInfinity;
        }
        else {
          local_85 = local_1c == kToPositiveInfinity;
        }
        HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
        ::setFromSignUnbiasedExponentAndNormalizedSignificand
                  (pHStack_18,(bool)(local_25 & 1),(int)local_3a,uStack_38,local_85);
      }
      else {
        uVar2 = HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
                ::negatable_left_shift<(short)13,_void>::val(exponent);
        pHVar1 = pHStack_18;
        uStack_48 = (uint)uVar2;
        uVar3 = 0;
        if ((local_25 & 1) != 0) {
          uVar3 = 0x80000000;
        }
        local_84 = uStack_48;
        if (uStack_48 == 0) {
          local_84 = 1;
        }
        FloatProxy<float>::FloatProxy(&local_4c,uVar3 | 0x7f800000 | local_84);
        HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
        ::set_value(pHVar1,local_4c);
      }
    }
    else {
      uVar3 = 0;
      if ((local_25 & 1) != 0) {
        uVar3 = 0x80000000;
      }
      FloatProxy<float>::FloatProxy(&local_44,uVar3 | 0x7f800000);
      HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
      ::set_value(pHVar1,local_44);
    }
  }
  return;
}

Assistant:

void castTo(other_T& other, round_direction round_dir) {
    other = other_T(static_cast<typename other_T::native_type>(0));
    bool negate = isNegative();
    if (getUnsignedBits() == 0) {
      if (negate) {
        other.set_value(-other.value());
      }
      return;
    }
    uint_type significand = getSignificandBits();
    bool carried = false;
    typename other_T::uint_type rounded_significand =
        getRoundedNormalizedSignificand<other_T>(round_dir, &carried);

    int_type exponent = getUnbiasedExponent();
    if (exponent == min_exponent) {
      // If we are denormal, normalize the exponent, so that we can encode
      // easily.
      exponent = static_cast<int_type>(exponent + 1);
      for (uint_type check_bit = first_exponent_bit >> 1; check_bit != 0;
           check_bit = static_cast<uint_type>(check_bit >> 1)) {
        exponent = static_cast<int_type>(exponent - 1);
        if (check_bit & significand) break;
      }
    }

    bool is_nan =
        (getBits() & exponent_mask) == exponent_mask && significand != 0;
    bool is_inf =
        !is_nan &&
        ((exponent + carried) > static_cast<int_type>(other_T::exponent_bias) ||
         (significand == 0 && (getBits() & exponent_mask) == exponent_mask));

    // If we are Nan or Inf we should pass that through.
    if (is_inf) {
      other.set_value(typename other_T::underlying_type(
          static_cast<typename other_T::uint_type>(
              (negate ? other_T::sign_mask : 0) | other_T::exponent_mask)));
      return;
    }
    if (is_nan) {
      typename other_T::uint_type shifted_significand;
      shifted_significand = static_cast<typename other_T::uint_type>(
          negatable_left_shift<
              static_cast<int_type>(other_T::num_fraction_bits) -
              static_cast<int_type>(num_fraction_bits)>::val(significand));

      // We are some sort of Nan. We try to keep the bit-pattern of the Nan
      // as close as possible. If we had to shift off bits so we are 0, then we
      // just set the last bit.
      other.set_value(typename other_T::underlying_type(
          static_cast<typename other_T::uint_type>(
              (negate ? other_T::sign_mask : 0) | other_T::exponent_mask |
              (shifted_significand == 0 ? 0x1 : shifted_significand))));
      return;
    }

    bool round_underflow_up =
        isNegative() ? round_dir == round_direction::kToNegativeInfinity
                     : round_dir == round_direction::kToPositiveInfinity;
    using other_int_type = typename other_T::int_type;
    // setFromSignUnbiasedExponentAndNormalizedSignificand will
    // zero out any underflowing value (but retain the sign).
    other.setFromSignUnbiasedExponentAndNormalizedSignificand(
        negate, static_cast<other_int_type>(exponent), rounded_significand,
        round_underflow_up);
    return;
  }